

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::switch_statement::print(switch_statement *this,wostream *os)

{
  expression *peVar1;
  pointer pcVar2;
  _Head_base<0UL,_mjs::expression_*,_false> _Var3;
  __uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_> _Var4;
  bool bVar5;
  wostream *pwVar6;
  case_clause *c;
  pointer pcVar7;
  ulong uVar8;
  
  pwVar6 = std::operator<<(os,"switch_statement{");
  peVar1 = (this->e_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar6);
  std::operator<<(pwVar6,", [");
  pcVar7 = (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar7 != pcVar2) {
    bVar5 = true;
    do {
      if (!bVar5) {
        std::operator<<(os,", ");
      }
      std::operator<<(os,"{");
      _Var3._M_head_impl =
           (pcVar7->e_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      if (_Var3._M_head_impl != (expression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_syntax_node + 0x10))
                  (_Var3._M_head_impl,os);
        std::operator<<(os,", ");
      }
      std::operator<<(os,"[");
      if ((pcVar7->sl_).
          super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pcVar7->sl_).
          super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar8 = 0;
        do {
          if (uVar8 != 0) {
            std::operator<<(os,", ");
          }
          _Var4._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
          super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
               (pcVar7->sl_).
               super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 0x10)
          )(_Var4._M_t.
            super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
            super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,os);
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)(pcVar7->sl_).
                                       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pcVar7->sl_).
                                       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::operator<<(os,"]}");
      pcVar7 = pcVar7 + 1;
      bVar5 = false;
    } while (pcVar7 != pcVar2);
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "switch_statement{" << e() << ", [";
        bool first = true;
        for (const auto& c: cl()) {
            if (!first) os << ", ";
            first = false;
            os << "{";
            if (c.e()) {
                os << *c.e() << ", ";
            }
            os << "[";
            for (size_t i = 0; i < c.sl().size(); ++i) {
                if (i) os << ", ";
                os << *c.sl()[i];
            }
            os << "]}";
        }
        os << "]}";
    }